

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

void __thiscall skiwi::Variable::~Variable(Variable *this)

{
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Variable() : line_nr(-1), column_nr(-1), tail_position(false), scan_index(0), pre_scan_index(0) {}